

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Load_Glyph(FT_Face face,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Pos *pFVar1;
  FT_Int FVar2;
  FT_GlyphSlot slot;
  FT_Driver pFVar3;
  FT_Module pFVar4;
  ulong uVar5;
  long lVar6;
  FT_Size pFVar7;
  FT_Face_Internal pFVar8;
  FT_Library library;
  FT_Render_Mode render_mode;
  FT_Error FVar9;
  FT_Error FVar10;
  FT_Render_Mode FVar11;
  char *pcVar12;
  FT_Pos FVar13;
  FT_Long FVar14;
  FT_Renderer_conflict pFVar15;
  uint uVar16;
  ulong uVar17;
  FT_Pos FVar18;
  ulong uVar19;
  uint uVar20;
  FT_Glyph_Format format;
  bool bVar21;
  ulong uVar22;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (face->size == (FT_Size)0x0) {
    return 0x23;
  }
  slot = face->glyph;
  if (slot == (FT_GlyphSlot)0x0) {
    return 0x23;
  }
  ft_glyphslot_free_bitmap(slot);
  (slot->bitmap).rows = 0;
  (slot->bitmap).width = 0;
  (slot->bitmap).pitch = 0;
  (slot->bitmap).pixel_mode = '\0';
  slot->format = FT_GLYPH_FORMAT_NONE;
  (slot->metrics).width = 0;
  (slot->metrics).height = 0;
  (slot->metrics).horiBearingX = 0;
  (slot->metrics).horiBearingY = 0;
  (slot->metrics).horiAdvance = 0;
  (slot->metrics).vertBearingX = 0;
  (slot->metrics).vertBearingY = 0;
  (slot->metrics).vertAdvance = 0;
  slot->linearHoriAdvance = 0;
  slot->linearVertAdvance = 0;
  slot->bitmap_left = 0;
  slot->bitmap_top = 0;
  (slot->outline).n_contours = 0;
  (slot->outline).n_points = 0;
  *(undefined4 *)&(slot->outline).field_0x4 = 0;
  (slot->outline).points = (FT_Vector *)0x0;
  (slot->outline).tags = (char *)0x0;
  (slot->outline).contours = (short *)0x0;
  (slot->outline).flags = 0;
  *(undefined4 *)&(slot->outline).field_0x24 = 0;
  slot->num_subglyphs = 0;
  slot->subglyphs = (FT_SubGlyph)0x0;
  slot->control_data = (void *)0x0;
  slot->control_len = 0;
  slot->lsb_delta = 0;
  slot->rsb_delta = 0;
  slot->other = (void *)0x0;
  pFVar3 = face->driver;
  uVar16 = load_flags | 0x801;
  if (((uint)load_flags >> 10 & 1) == 0) {
    uVar16 = load_flags;
  }
  uVar20 = uVar16 & 0xfffffff1 | 10;
  if ((uVar16 & 1) == 0) {
    uVar20 = uVar16;
  }
  pFVar4 = ((pFVar3->root).library)->auto_hinter;
  uVar16 = uVar20 & 0xfffffffb;
  if ((uVar20 >> 0x16 & 1) == 0) {
    uVar16 = uVar20;
  }
  if ((((pFVar4 == (FT_Module)0x0) || ((uVar16 & 0x8002) != 0)) ||
      (uVar5 = ((pFVar3->root).clazz)->module_flags, ((uint)uVar5 & 0x300) != 0x100)) ||
     ((uVar17 = face->face_flags, ((uint)uVar17 >> 0xd & 1) != 0 ||
      (((uVar16 >> 0xb & 1) == 0 &&
       (((face->internal->transform_matrix).yx == 0) == ((face->internal->transform_matrix).xx == 0)
       )))))) {
LAB_001318b4:
    FVar9 = (*pFVar3->clazz->load_glyph)(slot,face->size,glyph_index,uVar16);
    if (FVar9 != 0) {
      return FVar9;
    }
    FVar9 = 0;
    if (slot->format == FT_GLYPH_FORMAT_OUTLINE) {
      FVar10 = FT_Outline_Check(&slot->outline);
      if (FVar10 != 0) {
        return FVar10;
      }
      if ((uVar16 & 2) == 0) {
        if ((uVar16 & 0x10) == 0) {
          (slot->metrics).vertBearingX = (slot->metrics).vertBearingX & 0xffffffffffffffc0;
          (slot->metrics).vertBearingY = (slot->metrics).vertBearingY & 0xffffffffffffffc0;
          uVar5 = (slot->metrics).horiBearingX;
          lVar6 = (slot->metrics).horiBearingY;
          uVar17 = uVar5 & 0xffffffffffffffc0;
          (slot->metrics).horiBearingX = uVar17;
          uVar19 = lVar6 + 0x3fU & 0xffffffffffffffc0;
          (slot->metrics).horiBearingY = uVar19;
          (slot->metrics).width =
               ((slot->metrics).width + uVar5 + 0x3f & 0xffffffffffffffc0) - uVar17;
          (slot->metrics).height = uVar19 - (lVar6 - (slot->metrics).height & 0xffffffffffffffc0U);
        }
        else {
          pFVar1 = &(slot->metrics).horiBearingX;
          *(byte *)pFVar1 = (byte)*pFVar1 & 0xc0;
          (slot->metrics).horiBearingY = (slot->metrics).horiBearingY + 0x3fU & 0xffffffffffffffc0;
          uVar5 = (slot->metrics).vertBearingX;
          uVar17 = (slot->metrics).vertBearingY;
          uVar19 = uVar5 & 0xffffffffffffffc0;
          uVar22 = uVar17 & 0xffffffffffffffc0;
          (slot->metrics).vertBearingX = uVar19;
          (slot->metrics).vertBearingY = uVar22;
          (slot->metrics).width =
               ((slot->metrics).width + uVar5 + 0x3f & 0xffffffffffffffc0) - uVar19;
          (slot->metrics).height =
               ((slot->metrics).height + uVar17 + 0x3f & 0xffffffffffffffc0) - uVar22;
        }
        (slot->metrics).horiAdvance = (slot->metrics).horiAdvance + 0x20U & 0xffffffffffffffc0;
        (slot->metrics).vertAdvance = (slot->metrics).vertAdvance + 0x20U & 0xffffffffffffffc0;
      }
    }
  }
  else {
    if (((uVar16 & 0x20) == 0) && ((uVar5 & 0x400) != 0)) {
      pcVar12 = FT_Get_Font_Format(face);
      pcVar12 = strstr(pcVar12,"Type 1");
      if (pcVar12 == (char *)0x0) {
        bVar21 = false;
      }
      else {
        bVar21 = *(int *)&pFVar3[1].root.clazz == 1;
      }
      if (((uVar16 & 0xf0000) != 0x10000) ||
         ((*(byte *)((long)&((pFVar3->root).clazz)->module_flags + 1) >> 3 & 1) != 0 || bVar21)) {
        uVar17 = face->face_flags;
        if ((((uVar17 & 8) == 0) ||
            (((face[4].sizes_list.tail == (FT_ListNode)0x0 ||
              (*(short *)((long)&face[1].extensions + 6) != 0)) ||
             (*(long *)&face[4].num_fixed_sizes != 0)))) || (*(long *)&face[4].num_charmaps != 0))
        goto LAB_001318b4;
      }
      else {
        uVar17 = face->face_flags;
      }
    }
    if ((((uVar17 & 2) == 0) || ((uVar16 & 8) != 0)) ||
       ((FVar9 = (*pFVar3->clazz->load_glyph)(slot,face->size,glyph_index,uVar16 | 0x4000),
        FVar9 != 0 || (FVar9 = 0, slot->format != FT_GLYPH_FORMAT_BITMAP)))) {
      pFVar8 = face->internal;
      FVar2 = pFVar8->transform_flags;
      pFVar8->transform_flags = 0;
      FVar9 = (**(code **)((long)pFVar4->clazz->module_interface + 0x18))
                        (pFVar4,slot,face->size,glyph_index,uVar16);
      pFVar8->transform_flags = FVar2;
    }
  }
  if ((uVar16 & 0x10) == 0) {
    FVar18 = (slot->metrics).horiAdvance;
    FVar13 = 0;
  }
  else {
    FVar13 = (slot->metrics).vertAdvance;
    FVar18 = 0;
  }
  (slot->advance).x = FVar18;
  (slot->advance).y = FVar13;
  if (((uVar16 >> 0xd & 1) == 0) && ((face->face_flags & 1) != 0)) {
    pFVar7 = face->size;
    FVar14 = FT_MulDiv(slot->linearHoriAdvance,(pFVar7->metrics).x_scale,0x40);
    slot->linearHoriAdvance = FVar14;
    FVar14 = FT_MulDiv(slot->linearVertAdvance,(pFVar7->metrics).y_scale,0x40);
    slot->linearVertAdvance = FVar14;
  }
  if ((uVar16 >> 0xb & 1) != 0) goto LAB_00131a79;
  pFVar8 = face->internal;
  uVar20 = pFVar8->transform_flags;
  if (uVar20 == 0) goto LAB_00131a79;
  library = (slot->face->driver->root).library;
  pFVar15 = library->cur_renderer;
  if (pFVar15 == (FT_Renderer_conflict)0x0) {
    format = slot->format;
LAB_00131a3b:
    pFVar15 = FT_Lookup_Renderer(library,format,(FT_ListNode *)0x0);
    if (pFVar15 != (FT_Renderer_conflict)0x0) goto LAB_00131a54;
    if (format == FT_GLYPH_FORMAT_OUTLINE) {
      if ((uVar20 & 1) != 0) {
        FT_Outline_Transform(&slot->outline,&pFVar8->transform_matrix);
        uVar20 = pFVar8->transform_flags;
      }
      if ((uVar20 & 2) != 0) {
        FT_Outline_Translate(&slot->outline,(pFVar8->transform_delta).x,(pFVar8->transform_delta).y)
        ;
      }
    }
  }
  else {
    format = slot->format;
    if (pFVar15->glyph_format != format) goto LAB_00131a3b;
LAB_00131a54:
    FVar9 = (*pFVar15->clazz->transform_glyph)
                      (pFVar15,slot,&pFVar8->transform_matrix,&pFVar8->transform_delta);
  }
  FT_Vector_Transform(&slot->advance,&pFVar8->transform_matrix);
LAB_00131a79:
  if ((((FVar9 == 0) && (FVar9 = 0, (uVar16 & 1) == 0)) && (slot->format != FT_GLYPH_FORMAT_BITMAP))
     && (slot->format != FT_GLYPH_FORMAT_COMPOSITE)) {
    FVar11 = uVar16 >> 0x10 & 0xf;
    render_mode = uVar16 >> 0xb & FT_RENDER_MODE_MONO;
    if (FVar11 != FT_RENDER_MODE_NORMAL) {
      render_mode = FVar11;
    }
    if ((uVar16 & 4) != 0) {
      FVar9 = FT_Render_Glyph(slot,render_mode);
      return FVar9;
    }
    FVar9 = 0;
    ft_glyphslot_preset_bitmap(slot,render_mode,(FT_Vector *)0x0);
  }
  return FVar9;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Glyph( FT_Face   face,
                 FT_UInt   glyph_index,
                 FT_Int32  load_flags )
  {
    FT_Error      error;
    FT_Driver     driver;
    FT_GlyphSlot  slot;
    FT_Library    library;
    FT_Bool       autohint = FALSE;
    FT_Module     hinter;
    TT_Face       ttface = (TT_Face)face;


    if ( !face || !face->size || !face->glyph )
      return FT_THROW( Invalid_Face_Handle );

    /* The validity test for `glyph_index' is performed by the */
    /* font drivers.                                           */

    slot = face->glyph;
    ft_glyphslot_clear( slot );

    driver  = face->driver;
    library = driver->root.library;
    hinter  = library->auto_hinter;

    /* resolve load flags dependencies */

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE         |
                    FT_LOAD_IGNORE_TRANSFORM;

    if ( load_flags & FT_LOAD_NO_SCALE )
    {
      load_flags |= FT_LOAD_NO_HINTING |
                    FT_LOAD_NO_BITMAP;

      load_flags &= ~FT_LOAD_RENDER;
    }

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      load_flags &= ~FT_LOAD_RENDER;

    /*
     * Determine whether we need to auto-hint or not.
     * The general rules are:
     *
     * - Do only auto-hinting if we have
     *
     *   - a hinter module,
     *   - a scalable font format dealing with outlines,
     *   - not a tricky font, and
     *   - no transforms except simple slants and/or rotations by
     *     integer multiples of 90 degrees.
     *
     * - Then, auto-hint if FT_LOAD_FORCE_AUTOHINT is set or if we don't
     *   have a native font hinter.
     *
     * - Otherwise, auto-hint for LIGHT hinting mode or if there isn't
     *   any hinting bytecode in the TrueType/OpenType font.
     *
     * - Exception: The font is `tricky' and requires the native hinter to
     *   load properly.
     */

    if ( hinter                                           &&
         !( load_flags & FT_LOAD_NO_HINTING )             &&
         !( load_flags & FT_LOAD_NO_AUTOHINT )            &&
         FT_DRIVER_IS_SCALABLE( driver )                  &&
         FT_DRIVER_USES_OUTLINES( driver )                &&
         !FT_IS_TRICKY( face )                            &&
         ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM )    ||
           ( face->internal->transform_matrix.yx == 0 &&
             face->internal->transform_matrix.xx != 0 ) ||
           ( face->internal->transform_matrix.xx == 0 &&
             face->internal->transform_matrix.yx != 0 ) ) )
    {
      if ( ( load_flags & FT_LOAD_FORCE_AUTOHINT ) ||
           !FT_DRIVER_HAS_HINTER( driver )         )
        autohint = TRUE;
      else
      {
        FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );
        FT_Bool         is_light_type1;


        /* only the new Adobe engine (for both CFF and Type 1) is `light'; */
        /* we use `strstr' to catch both `Type 1' and `CID Type 1'         */
        is_light_type1 =
          ft_strstr( FT_Get_Font_Format( face ), "Type 1" ) != NULL   &&
          ((PS_Driver)driver)->hinting_engine == FT_HINTING_ADOBE;

        /* the check for `num_locations' assures that we actually    */
        /* test for instructions in a TTF and not in a CFF-based OTF */
        /*                                                           */
        /* since `maxSizeOfInstructions' might be unreliable, we     */
        /* check the size of the `fpgm' and `prep' tables, too --    */
        /* the assumption is that there don't exist real TTFs where  */
        /* both `fpgm' and `prep' tables are missing                 */
        if ( ( mode == FT_RENDER_MODE_LIGHT           &&
               ( !FT_DRIVER_HINTS_LIGHTLY( driver ) &&
                 !is_light_type1                    ) )         ||
             ( FT_IS_SFNT( face )                             &&
               ttface->num_locations                          &&
               ttface->max_profile.maxSizeOfInstructions == 0 &&
               ttface->font_program_size == 0                 &&
               ttface->cvt_program_size == 0                  ) )
          autohint = TRUE;
      }
    }

    if ( autohint )
    {
      FT_AutoHinter_Interface  hinting;


      /* try to load embedded bitmaps first if available            */
      /*                                                            */
      /* XXX: This is really a temporary hack that should disappear */
      /*      promptly with FreeType 2.1!                           */
      /*                                                            */
      if ( FT_HAS_FIXED_SIZES( face )              &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SBITS_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_BITMAP )
          goto Load_Ok;
      }

      {
        FT_Face_Internal  internal        = face->internal;
        FT_Int            transform_flags = internal->transform_flags;


        /* since the auto-hinter calls FT_Load_Glyph by itself, */
        /* make sure that glyphs aren't transformed             */
        internal->transform_flags = 0;

        /* load auto-hinted outline */
        hinting = (FT_AutoHinter_Interface)hinter->clazz->module_interface;

        error   = hinting->load_glyph( (FT_AutoHinter)hinter,
                                       slot, face->size,
                                       glyph_index, load_flags );

        internal->transform_flags = transform_flags;
      }
    }
    else
    {
      error = driver->clazz->load_glyph( slot,
                                         face->size,
                                         glyph_index,
                                         load_flags );
      if ( error )
        goto Exit;

      if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
      {
        /* check that the loaded outline is correct */
        error = FT_Outline_Check( &slot->outline );
        if ( error )
          goto Exit;

#ifdef GRID_FIT_METRICS
        if ( !( load_flags & FT_LOAD_NO_HINTING ) )
          ft_glyphslot_grid_fit_metrics( slot,
              FT_BOOL( load_flags & FT_LOAD_VERTICAL_LAYOUT ) );
#endif
      }
    }

  Load_Ok:
    /* compute the advance */
    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      slot->advance.x = 0;
      slot->advance.y = slot->metrics.vertAdvance;
    }
    else
    {
      slot->advance.x = slot->metrics.horiAdvance;
      slot->advance.y = 0;
    }

    /* compute the linear advance in 16.16 pixels */
    if ( ( load_flags & FT_LOAD_LINEAR_DESIGN ) == 0 &&
         FT_IS_SCALABLE( face )                      )
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      /* it's tricky! */
      slot->linearHoriAdvance = FT_MulDiv( slot->linearHoriAdvance,
                                           metrics->x_scale, 64 );

      slot->linearVertAdvance = FT_MulDiv( slot->linearVertAdvance,
                                           metrics->y_scale, 64 );
    }

    if ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM ) == 0 )
    {
      FT_Face_Internal  internal = face->internal;


      /* now, transform the glyph image if needed */
      if ( internal->transform_flags )
      {
        /* get renderer */
        FT_Renderer  renderer = ft_lookup_glyph_renderer( slot );


        if ( renderer )
          error = renderer->clazz->transform_glyph(
                                     renderer, slot,
                                     &internal->transform_matrix,
                                     &internal->transform_delta );
        else if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          /* apply `standard' transformation if no renderer is available */
          if ( internal->transform_flags & 1 )
            FT_Outline_Transform( &slot->outline,
                                  &internal->transform_matrix );

          if ( internal->transform_flags & 2 )
            FT_Outline_Translate( &slot->outline,
                                  internal->transform_delta.x,
                                  internal->transform_delta.y );
        }

        /* transform advance */
        FT_Vector_Transform( &slot->advance, &internal->transform_matrix );
      }
    }

    /* do we need to render the image or preset the bitmap now? */
    if ( !error                                    &&
         ( load_flags & FT_LOAD_NO_SCALE ) == 0    &&
         slot->format != FT_GLYPH_FORMAT_BITMAP    &&
         slot->format != FT_GLYPH_FORMAT_COMPOSITE )
    {
      FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );


      if ( mode == FT_RENDER_MODE_NORMAL   &&
           load_flags & FT_LOAD_MONOCHROME )
        mode = FT_RENDER_MODE_MONO;

      if ( load_flags & FT_LOAD_RENDER )
        error = FT_Render_Glyph( slot, mode );
      else
        ft_glyphslot_preset_bitmap( slot, mode, NULL );
    }

    FT_TRACE5(( "FT_Load_Glyph: index %d, flags %x\n",
                glyph_index, load_flags               ));
    FT_TRACE5(( "  x advance: %f\n", slot->advance.x / 64.0 ));
    FT_TRACE5(( "  y advance: %f\n", slot->advance.y / 64.0 ));
    FT_TRACE5(( "  linear x advance: %f\n",
                slot->linearHoriAdvance / 65536.0 ));
    FT_TRACE5(( "  linear y advance: %f\n",
                slot->linearVertAdvance / 65536.0 ));
    FT_TRACE5(( "  bitmap %dx%d, mode %d\n",
                slot->bitmap.width, slot->bitmap.rows,
                slot->bitmap.pixel_mode               ));

  Exit:
    return error;
  }